

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void __thiscall network::network(network *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_inetwork)._vptr_inetwork = (_func_int **)&PTR_update_0010dbe8;
  p_Var1 = &(this->objects_)._M_t._M_impl.super__Rb_tree_header;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->last_netid_ = 0;
  this->frame_ = (iframe *)0x0;
  return;
}

Assistant:

network::network()
{
    last_netid_ = 0;
    frame_ = NULL;
}